

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

NamedValueExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::NamedValueExpression,slang::ast::ValueSymbol_const&,slang::SourceRange&>
          (BumpAllocator *this,ValueSymbol *args,SourceRange *args_1)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  Type *pTVar3;
  NamedValueExpression *pNVar4;
  
  pNVar4 = (NamedValueExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NamedValueExpression *)this->endPtr < pNVar4 + 1) {
    pNVar4 = (NamedValueExpression *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pNVar4 + 1);
  }
  SVar1 = args_1->startLoc;
  SVar2 = args_1->endLoc;
  pTVar3 = ast::DeclaredType::getType(&args->declaredType);
  (pNVar4->super_ValueExpressionBase).super_Expression.kind = NamedValue;
  (pNVar4->super_ValueExpressionBase).super_Expression.type.ptr = pTVar3;
  (pNVar4->super_ValueExpressionBase).super_Expression.constant = (ConstantValue *)0x0;
  (pNVar4->super_ValueExpressionBase).super_Expression.syntax = (ExpressionSyntax *)0x0;
  (pNVar4->super_ValueExpressionBase).super_Expression.sourceRange.startLoc = SVar1;
  (pNVar4->super_ValueExpressionBase).super_Expression.sourceRange.endLoc = SVar2;
  (pNVar4->super_ValueExpressionBase).symbol = args;
  return pNVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }